

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::allTrueI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  int32_t iVar2;
  long lVar3;
  Literal local_78;
  undefined1 local_60 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_60,this);
  lVar3 = 0;
  do {
    if (lVar3 + 0x18 == 0x48) {
      iVar2 = 1;
      goto LAB_009d0070;
    }
    makeZero(&local_78,(Type)*(uintptr_t *)((long)&lanes._M_elems[0].field_0 + lVar3 + 8));
    bVar1 = operator==((Literal *)(local_60 + lVar3),&local_78);
    ~Literal(&local_78);
    lVar3 = lVar3 + 0x18;
  } while (!bVar1);
  iVar2 = 0;
LAB_009d0070:
  (__return_storage_ptr__->field_0).i32 = iVar2;
  (__return_storage_ptr__->type).id = 2;
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::allTrueI64x2() const {
  return all_true<2, &Literal::getLanesI64x2>(*this);
}